

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::values::standard_value<bool>::standard_value(standard_value<bool> *this)

{
  element_type *peVar1;
  standard_value<bool> *this_local;
  
  Value::Value(&this->super_Value);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR_parse_001b7c58;
  std::make_shared<bool>();
  peVar1 = std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->m_result).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
  this->m_store = peVar1;
  this->m_default = false;
  std::__cxx11::string::string((string *)&this->m_default_value);
  this->m_implicit = false;
  std::__cxx11::string::string((string *)&this->m_implicit_value);
  return;
}

Assistant:

standard_value()
      : m_result(std::make_shared<T>())
      , m_store(m_result.get())
      {
      }